

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  int extraout_EAX;
  BasicBlock *trueBlock;
  BasicBlock *falseBlock;
  BasicBlock *target;
  undefined4 in_register_00000034;
  string local_58;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000034,__fd);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"trueBlock","");
  this_00 = &this->super_IRBuilder;
  trueBlock = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"falseBlock","");
  falseBlock = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"contBlock","");
  target = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  lVar3 = local_38;
  (**(code **)(**(long **)(local_38 + 0x40) + 0x10))(*(long **)(local_38 + 0x40),this);
  IRBuilder::createCondBr(this_00,this->result_,trueBlock,falseBlock);
  IRBuilder::setInsertPoint(this_00,trueBlock);
  plVar2 = *(long **)(lVar3 + 0x48);
  if (plVar2 == (long *)0x0) {
    this->result_ = (Value *)0x0;
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2,this);
  }
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,falseBlock);
  plVar2 = *(long **)(lVar3 + 0x50);
  if (plVar2 == (long *)0x0) {
    this->result_ = (Value *)0x0;
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2,this);
  }
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,target);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(CondStmt& condStmt) {
  BasicBlock* trueBlock = createBlock("trueBlock");
  BasicBlock* falseBlock = createBlock("falseBlock");
  BasicBlock* contBlock = createBlock("contBlock");

  Value* cond = codegen(condStmt.condition());
  createCondBr(cond, trueBlock, falseBlock);

  setInsertPoint(trueBlock);
  codegen(condStmt.thenStmt());
  createBr(contBlock);

  setInsertPoint(falseBlock);
  codegen(condStmt.elseStmt());
  createBr(contBlock);

  setInsertPoint(contBlock);
}